

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O2

char * archive_read_disk_gname(archive *_a,la_int64_t gid)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  char *pcVar2;
  
  iVar1 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_gname");
  if ((iVar1 == 0) &&
     (UNRECOVERED_JUMPTABLE = (code *)_a[1].error_string.length,
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    pcVar2 = (char *)(*UNRECOVERED_JUMPTABLE)(_a[1].current_code,gid);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char *
archive_read_disk_gname(struct archive *_a, la_int64_t gid)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	if (ARCHIVE_OK != __archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
		ARCHIVE_STATE_ANY, "archive_read_disk_gname"))
		return (NULL);
	if (a->lookup_gname == NULL)
		return (NULL);
	return ((*a->lookup_gname)(a->lookup_gname_data, gid));
}